

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_gAMA(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  undefined8 in_RAX;
  uint gAMA;
  char *error_message;
  png_byte buf [4];
  
  buf = SUB84((ulong)in_RAX >> 0x20,0);
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if (length == 4) {
      png_crc_read(png_ptr,buf,4);
      iVar1 = png_crc_finish(png_ptr,0);
      if (iVar1 == 0) {
        if ((int)buf << 0x18 < 0) {
          gAMA = 0xffffffff;
        }
        else {
          gAMA = (uint)buf >> 0x18 | ((uint)buf >> 8 & 0xff) << 0x10 |
                 ((uint)buf >> 0x10 & 0xff) << 8 | (int)buf << 0x18;
        }
        png_colorspace_set_gamma(png_ptr,&png_ptr->colorspace,gAMA);
        png_colorspace_sync(png_ptr,info_ptr);
      }
      return;
    }
    png_crc_finish(png_ptr,length);
    error_message = "invalid";
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_gAMA(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_fixed_point igamma;
   png_byte buf[4];

   png_debug(1, "in png_handle_gAMA");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 4)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 4);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   igamma = png_get_fixed_point(NULL, buf);

   png_colorspace_set_gamma(png_ptr, &png_ptr->colorspace, igamma);
   png_colorspace_sync(png_ptr, info_ptr);
}